

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::GridSample_x86_fma::forward
          (GridSample_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  Mat *src;
  Mat *this_00;
  size_t sVar10;
  int *piVar11;
  void *pvVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  float fVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  int iVar23;
  int iVar24;
  Option *opt_00;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  Allocator *pAVar28;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [16];
  void *pvVar31;
  char *__ptr;
  int *offset_ptr;
  int iVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  int i_1;
  undefined4 *puVar36;
  int i;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar48 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  float fVar47;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar54 [16];
  float fVar53;
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  float fVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  __m256 y_coeffs3;
  __m256 y_coeffs2;
  __m256 y_coeffs1;
  __m256 y_coeffs0;
  __m256 x_coeffs3;
  __m256 x_coeffs2;
  __m256 x_coeffs1;
  __m256 x_coeffs0;
  __m256 value_f [4];
  size_t sStackY_2e8;
  undefined1 local_2a0 [32];
  Allocator *local_280;
  int iStack_278;
  int iStack_274;
  size_t sStack_270;
  int local_268;
  size_t local_260;
  Mat local_250;
  Allocator *local_208;
  float local_200;
  undefined1 auStack_1fc [12];
  undefined1 auStack_1f0 [16];
  float local_1e0;
  undefined1 auStack_1dc [12];
  undefined1 auStack_1d0 [16];
  float local_1c0;
  undefined1 auStack_1bc [12];
  undefined1 auStack_1b0 [16];
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float local_180;
  undefined1 auStack_17c [12];
  undefined1 auStack_170 [16];
  float local_160;
  undefined1 auStack_15c [12];
  undefined1 auStack_150 [16];
  float local_140;
  undefined1 auStack_13c [12];
  undefined1 auStack_130 [16];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float local_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 auStack_e4 [4];
  float local_e0 [4];
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar9 = src->elempack;
  iVar24 = src->c;
  iVar32 = src->dims;
  sVar10 = src->elemsize;
  local_260 = 0;
  local_2a0._0_8_ = (Allocator *)0x0;
  local_2a0._8_4_ = 0;
  local_2a0._12_4_ = 0;
  local_2a0._16_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  local_250.cstep = 0;
  sStack_270 = SUB168(ZEXT816(0) << 0x40,4);
  local_268 = 0;
  local_250.h = 0;
  local_280 = (Allocator *)local_2a0._0_8_;
  iStack_278 = local_2a0._8_4_;
  iStack_274 = local_2a0._12_4_;
  local_250.data = (void *)local_2a0._0_8_;
  local_250.refcount._0_4_ = local_2a0._8_4_;
  local_250.refcount._4_4_ = local_2a0._12_4_;
  local_250.elemsize = sStack_270;
  local_250.elempack = local_268;
  local_250.allocator = (Allocator *)local_2a0._0_8_;
  local_250.dims = local_2a0._8_4_;
  local_250.w = local_2a0._12_4_;
  local_250.d = local_2a0._8_4_;
  local_250.c = local_268;
  if (src[1].elempack == 1) {
    if (&local_250 != src + 1) {
      piVar11 = src[1].refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      local_250.data = src[1].data;
      local_250.refcount._0_4_ = (int)src[1].refcount;
      local_250.refcount._4_4_ = (int)((ulong)src[1].refcount >> 0x20);
      local_250.elemsize = src[1].elemsize;
      local_250.elempack = src[1].elempack;
      local_250.allocator = src[1].allocator;
      uVar5 = src[1].dims;
      uVar6 = src[1].w;
      uVar7 = src[1].h;
      uVar8 = src[1].d;
      local_250.c = src[1].c;
      local_250.cstep = src[1].cstep;
      local_250.dims = uVar5;
      local_250.w = uVar6;
      local_250.h = uVar7;
      local_250.d = uVar8;
    }
  }
  else {
    convert_packing(src + 1,&local_250,1,opt);
  }
  iVar35 = -100;
  if (iVar32 == 3) {
    iVar17 = local_250.h;
    iVar23 = local_250.w;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar17 = local_250.c;
      iVar23 = local_250.h;
    }
    Mat::create(this_00,iVar23,iVar17,iVar24,sVar10,uVar9,opt->blob_allocator);
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
    goto LAB_0052d2ea;
    iVar24 = (this->super_GridSample).sample_type;
    if (iVar24 == 1) {
      Mat::create((Mat *)local_2a0,iVar23,iVar17,sVar10 * 6,6,opt->workspace_allocator);
      if (((Allocator *)local_2a0._0_8_ == (Allocator *)0x0) || ((long)local_268 * local_260 == 0))
      goto LAB_0052d2ea;
      iVar24 = (this->super_GridSample).padding_mode;
      if (iVar24 == 3) {
        iVar24 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
LAB_0052bfbf:
        iVar24 = (this->super_GridSample).sample_type;
        goto LAB_0052bfca;
      }
      if (iVar24 == 2) {
        iVar24 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
        goto LAB_0052bfbf;
      }
      if (iVar24 == 1) {
        iVar24 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
        goto LAB_0052bfbf;
      }
LAB_0052d2c0:
      fwrite("gridsample padding_mode error\n",0x1e,1,_stderr);
      fputc(10,_stderr);
      goto LAB_0052d2ea;
    }
LAB_0052bfca:
    if (iVar24 == 2) {
      Mat::create((Mat *)local_2a0,iVar23,iVar17,1,sVar10,1,opt->workspace_allocator);
      if (((Allocator *)local_2a0._0_8_ == (Allocator *)0x0) || ((long)local_268 * local_260 == 0))
      goto LAB_0052d2ea;
      iVar24 = (this->super_GridSample).padding_mode;
      if (iVar24 == 3) {
        iVar24 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
      }
      else if (iVar24 == 2) {
        iVar24 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
      }
      else {
        if (iVar24 != 1) goto LAB_0052d2c0;
        iVar24 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      Mat::create((Mat *)local_2a0,iVar23,iVar17,sVar10 * 0x12,0x12,opt->workspace_allocator);
      if (((Allocator *)local_2a0._0_8_ == (Allocator *)0x0) || ((long)local_268 * local_260 == 0))
      goto LAB_0052d2ea;
      iVar24 = (this->super_GridSample).padding_mode;
      if (iVar24 == 3) {
        iVar24 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
      }
      else if (iVar24 == 2) {
        iVar24 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
      }
      else {
        if (iVar24 != 1) goto LAB_0052d370;
        iVar24 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_250,(Mat *)local_2a0,iVar24);
        }
      }
    }
    bVar37 = false;
  }
  else {
    if (iVar32 == 4) {
      iVar35 = local_250.d;
      iVar17 = local_250.w;
      iVar23 = local_250.h;
      if ((this->super_GridSample).permute_fusion == 0) {
        iVar35 = local_250.c;
        iVar17 = local_250.h;
        iVar23 = local_250.d;
      }
      Mat::create(this_00,iVar17,iVar23,iVar35,iVar24,sVar10,uVar9,opt->blob_allocator);
      if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
        iVar24 = (this->super_GridSample).sample_type;
        if (iVar24 != 1) {
LAB_0052c26c:
          if (iVar24 != 2) goto LAB_0052c41f;
          Mat::create((Mat *)local_2a0,iVar17,iVar23,iVar35,1,sVar10,1,opt->workspace_allocator);
          if ((Allocator *)local_2a0._0_8_ == (Allocator *)0x0) goto LAB_0052d2ba;
          iVar35 = -100;
          if ((long)local_268 * local_260 == 0) goto LAB_0052d2ea;
          iVar24 = (this->super_GridSample).padding_mode;
          if (iVar24 == 3) {
            iVar24 = (this->super_GridSample).permute_fusion;
            if ((this->super_GridSample).align_corner == 0) {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                        (src,&local_250,(Mat *)local_2a0,iVar24);
            }
            else {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                        (src,&local_250,(Mat *)local_2a0,iVar24);
            }
LAB_0052c41f:
            bVar37 = true;
            if ((this->super_GridSample).sample_type != 3) goto LAB_0052c43b;
            __ptr = "unsupported bicubic when dims == 4";
            sStackY_2e8 = 0x22;
            goto LAB_0052d2a6;
          }
          if (iVar24 == 2) {
            iVar24 = (this->super_GridSample).permute_fusion;
            if ((this->super_GridSample).align_corner == 0) {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                        (src,&local_250,(Mat *)local_2a0,iVar24);
            }
            else {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                        (src,&local_250,(Mat *)local_2a0,iVar24);
            }
            goto LAB_0052c41f;
          }
          if (iVar24 == 1) {
            iVar24 = (this->super_GridSample).permute_fusion;
            if ((this->super_GridSample).align_corner == 0) {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                        (src,&local_250,(Mat *)local_2a0,iVar24);
            }
            else {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                        (src,&local_250,(Mat *)local_2a0,iVar24);
            }
            goto LAB_0052c41f;
          }
LAB_0052d370:
          iVar35 = -100;
          fwrite("gridsample padding_mode error\n",0x1e,1,_stderr);
          fputc(10,_stderr);
          goto LAB_0052d2ea;
        }
        Mat::create((Mat *)local_2a0,iVar17,iVar23,iVar35,sVar10 * 0xb,0xb,opt->workspace_allocator)
        ;
        if (((Allocator *)local_2a0._0_8_ == (Allocator *)0x0) || ((long)local_268 * local_260 == 0)
           ) goto LAB_0052d2ba;
        iVar24 = (this->super_GridSample).padding_mode;
        if (iVar24 == 3) {
          iVar24 = (this->super_GridSample).permute_fusion;
          if ((this->super_GridSample).align_corner == 0) {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                      (src,&local_250,(Mat *)local_2a0,iVar24);
          }
          else {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                      (src,&local_250,(Mat *)local_2a0,iVar24);
          }
LAB_0052c261:
          iVar24 = (this->super_GridSample).sample_type;
          goto LAB_0052c26c;
        }
        if (iVar24 == 2) {
          iVar24 = (this->super_GridSample).permute_fusion;
          if ((this->super_GridSample).align_corner == 0) {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                      (src,&local_250,(Mat *)local_2a0,iVar24);
          }
          else {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                      (src,&local_250,(Mat *)local_2a0,iVar24);
          }
          goto LAB_0052c261;
        }
        if (iVar24 == 1) {
          iVar24 = (this->super_GridSample).permute_fusion;
          if ((this->super_GridSample).align_corner == 0) {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                      (src,&local_250,(Mat *)local_2a0,iVar24);
          }
          else {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                      (src,&local_250,(Mat *)local_2a0,iVar24);
          }
          goto LAB_0052c261;
        }
        __ptr = "gridsample padding_mode error\n";
        sStackY_2e8 = 0x1e;
LAB_0052d2a6:
        fwrite(__ptr,sStackY_2e8,1,_stderr);
        fputc(10,_stderr);
      }
LAB_0052d2ba:
      iVar35 = -100;
      goto LAB_0052d2ea;
    }
    bVar37 = false;
  }
LAB_0052c43b:
  opt_00 = (Option *)(ulong)uVar9;
  iVar24 = 0;
  iVar35 = iVar24;
  if (uVar9 == 1) {
    if (iVar32 == 3) {
      iVar24 = (this->super_GridSample).sample_type;
      if (iVar24 == 3) {
        iVar24 = this_00->h * this_00->w;
        pvVar12 = src->data;
        sVar10 = src->elemsize;
        sVar13 = src->cstep;
        pvVar31 = this_00->data;
        sVar14 = this_00->elemsize;
        sVar15 = this_00->cstep;
        local_208 = (Allocator *)local_2a0._0_8_;
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        uVar27 = (ulong)(uint)this_00->c;
        if (this_00->c < 1) {
          uVar27 = 0;
        }
        for (uVar26 = 0; uVar26 != uVar27; uVar26 = uVar26 + 1) {
          lVar34 = sVar10 * sVar13 * uVar26;
          puVar36 = (undefined4 *)(sVar14 * sVar15 * uVar26 + (long)pvVar31);
          pAVar28 = local_208;
          for (iVar32 = 0; iVar32 != iVar24; iVar32 = iVar32 + 1) {
            cubic_interp1d(&local_120,&local_140,&local_160,&local_180,
                           *(float *)&pAVar28->_vptr_Allocator);
            cubic_interp1d(&local_1a0,&local_1c0,&local_1e0,&local_200,
                           *(float *)((long)&pAVar28->_vptr_Allocator + 4));
            for (lVar33 = 2; lVar33 != 0x12; lVar33 = lVar33 + 4) {
              lVar25 = (long)*(int *)((long)&pAVar28->_vptr_Allocator + lVar33 * 4);
              auVar40 = ZEXT816(0) << 0x40;
              fVar47 = 0.0;
              if (-1 < lVar25) {
                fVar47 = *(float *)((long)pvVar12 + lVar25 * 4 + lVar34);
              }
              lVar25 = (long)*(int *)((long)&pAVar28->_vptr_Allocator + lVar33 * 4 + 4);
              if (-1 < lVar25) {
                auVar40 = ZEXT416(*(uint *)((long)pvVar12 + lVar25 * 4 + lVar34));
              }
              lVar25 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + lVar33 * 4);
              auVar43 = ZEXT816(0) << 0x40;
              auVar38 = ZEXT816(0) << 0x40;
              if (-1 < lVar25) {
                auVar38 = ZEXT416(*(uint *)((long)pvVar12 + lVar25 * 4 + lVar34));
              }
              lVar25 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + lVar33 * 4 + 4);
              if (-1 < lVar25) {
                auVar43 = ZEXT416(*(uint *)((long)pvVar12 + lVar25 * 4 + lVar34));
              }
              auVar40 = vfmadd213ss_fma(auVar40,ZEXT416((uint)local_140),
                                        ZEXT416((uint)(fVar47 * local_120)));
              auVar40 = vfmadd213ss_fma(auVar38,ZEXT416((uint)local_160),auVar40);
              auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)local_180),auVar43);
              *(int *)((long)local_e0 + lVar33 + -2) = auVar40._0_4_;
            }
            auVar40 = vinsertps_avx(ZEXT416((uint)local_1a0),ZEXT416((uint)local_1c0),0x10);
            auVar40 = vinsertps_avx(auVar40,ZEXT416((uint)local_1e0),0x20);
            auVar40 = vinsertps_avx(auVar40,ZEXT416((uint)local_200),0x30);
            auVar38._0_4_ = auVar40._0_4_ * local_e0[0];
            auVar38._4_4_ = auVar40._4_4_ * local_e0[1];
            auVar38._8_4_ = auVar40._8_4_ * local_e0[2];
            auVar38._12_4_ = auVar40._12_4_ * local_e0[3];
            auVar40 = vhaddps_avx(auVar38,auVar38);
            auVar40 = vhaddps_avx(auVar40,auVar40);
            *puVar36 = auVar40._0_4_;
            puVar36 = puVar36 + 1;
            pAVar28 = pAVar28 + 9;
          }
        }
LAB_0052d091:
        iVar35 = 0;
        goto LAB_0052d2ea;
      }
      if (iVar24 != 2) {
        if (iVar24 == 1) {
          iVar24 = this_00->h * this_00->w;
          pvVar12 = src->data;
          sVar10 = src->elemsize;
          sVar13 = src->cstep;
          pvVar31 = this_00->data;
          sVar14 = this_00->elemsize;
          sVar15 = this_00->cstep;
          if (iVar24 < 1) {
            iVar24 = 0;
          }
          uVar27 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar27 = 0;
          }
          for (uVar26 = 0; iVar35 = 0, uVar26 != uVar27; uVar26 = uVar26 + 1) {
            lVar33 = sVar10 * sVar13 * uVar26;
            pAVar28 = (Allocator *)local_2a0._0_8_;
            for (lVar34 = 0; iVar24 != (int)lVar34; lVar34 = lVar34 + 1) {
              fVar47 = 0.0;
              auVar40 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28->_vptr_Allocator) {
                auVar40 = ZEXT416(*(uint *)((long)pvVar12 +
                                           (long)*(int *)&pAVar28->_vptr_Allocator * 4 + lVar33));
              }
              lVar25 = (long)*(int *)((long)&pAVar28->_vptr_Allocator + 4);
              if (-1 < lVar25) {
                fVar47 = *(float *)((long)pvVar12 + lVar25 * 4 + lVar33);
              }
              fVar53 = 0.0;
              auVar38 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28[1]._vptr_Allocator) {
                auVar38 = ZEXT416(*(uint *)((long)pvVar12 +
                                           (long)*(int *)&pAVar28[1]._vptr_Allocator * 4 + lVar33));
              }
              lVar25 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + 4);
              if (-1 < lVar25) {
                fVar53 = *(float *)((long)pvVar12 + lVar25 * 4 + lVar33);
              }
              fVar60 = *(float *)&pAVar28[2]._vptr_Allocator;
              auVar40 = vfmadd213ss_fma(auVar40,ZEXT416((uint)(1.0 - fVar60)),
                                        ZEXT416((uint)(fVar60 * fVar47)));
              auVar38 = vfmadd213ss_fma(auVar38,ZEXT416((uint)(1.0 - fVar60)),
                                        ZEXT416((uint)(fVar60 * fVar53)));
              auVar40 = vfmadd132ss_fma(ZEXT416((uint)(auVar38._0_4_ - auVar40._0_4_)),auVar40,
                                        ZEXT416(*(uint *)((long)&pAVar28[2]._vptr_Allocator + 4)));
              *(int *)((long)pvVar31 + lVar34 * 4) = auVar40._0_4_;
              pAVar28 = pAVar28 + 3;
            }
            pvVar31 = (void *)((long)pvVar31 + sVar14 * sVar15);
          }
        }
        goto LAB_0052d2ea;
      }
    }
    else {
      if (!bVar37) goto LAB_0052d2ea;
      iVar24 = (this->super_GridSample).sample_type;
      if (iVar24 != 2) {
        if (iVar24 == 1) {
          iVar24 = this_00->h * this_00->w * this_00->d;
          pvVar12 = src->data;
          sVar10 = src->elemsize;
          sVar13 = src->cstep;
          pvVar31 = this_00->data;
          sVar14 = this_00->elemsize;
          sVar15 = this_00->cstep;
          iVar35 = 0;
          if (iVar24 < 1) {
            iVar24 = iVar35;
          }
          uVar27 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar27 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar27; uVar26 = uVar26 + 1) {
            lVar33 = sVar10 * sVar13 * uVar26;
            pAVar28 = (Allocator *)local_2a0._0_8_;
            for (lVar34 = 0; iVar24 != (int)lVar34; lVar34 = lVar34 + 1) {
              fVar47 = 0.0;
              auVar40 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28->_vptr_Allocator) {
                auVar40 = ZEXT416(*(uint *)((long)pvVar12 +
                                           (long)*(int *)&pAVar28->_vptr_Allocator * 4 + lVar33));
              }
              lVar25 = (long)*(int *)((long)&pAVar28->_vptr_Allocator + 4);
              if (-1 < lVar25) {
                fVar47 = *(float *)((long)pvVar12 + lVar25 * 4 + lVar33);
              }
              fVar53 = 0.0;
              auVar38 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28[1]._vptr_Allocator) {
                auVar38 = ZEXT416(*(uint *)((long)pvVar12 +
                                           (long)*(int *)&pAVar28[1]._vptr_Allocator * 4 + lVar33));
              }
              lVar25 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + 4);
              if (-1 < lVar25) {
                fVar53 = *(float *)((long)pvVar12 + lVar25 * 4 + lVar33);
              }
              fVar60 = 0.0;
              auVar43 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28[2]._vptr_Allocator) {
                auVar43 = ZEXT416(*(uint *)((long)pvVar12 +
                                           (long)*(int *)&pAVar28[2]._vptr_Allocator * 4 + lVar33));
              }
              lVar25 = (long)*(int *)((long)&pAVar28[2]._vptr_Allocator + 4);
              if (-1 < lVar25) {
                fVar60 = *(float *)((long)pvVar12 + lVar25 * 4 + lVar33);
              }
              fVar64 = 0.0;
              auVar48 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28[3]._vptr_Allocator) {
                auVar48 = ZEXT416(*(uint *)((long)pvVar12 +
                                           (long)*(int *)&pAVar28[3]._vptr_Allocator * 4 + lVar33));
              }
              lVar25 = (long)*(int *)((long)&pAVar28[3]._vptr_Allocator + 4);
              if (-1 < lVar25) {
                fVar64 = *(float *)((long)pvVar12 + lVar25 * 4 + lVar33);
              }
              fVar3 = *(float *)&pAVar28[4]._vptr_Allocator;
              fVar4 = *(float *)((long)&pAVar28[4]._vptr_Allocator + 4);
              fVar16 = 1.0 - fVar3;
              auVar40 = vfmadd213ss_fma(auVar40,ZEXT416((uint)fVar16),
                                        ZEXT416((uint)(fVar3 * fVar47)));
              auVar38 = vfmadd213ss_fma(auVar38,ZEXT416((uint)fVar16),
                                        ZEXT416((uint)(fVar3 * fVar53)));
              auVar43 = vfmadd213ss_fma(auVar43,ZEXT416((uint)fVar16),
                                        ZEXT416((uint)(fVar3 * fVar60)));
              auVar48 = vfmadd213ss_fma(auVar48,ZEXT416((uint)fVar16),
                                        ZEXT416((uint)(fVar3 * fVar64)));
              auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * auVar38._0_4_)),
                                        ZEXT416((uint)(1.0 - fVar4)),auVar40);
              auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * auVar48._0_4_)),
                                        ZEXT416((uint)(1.0 - fVar4)),auVar43);
              auVar40 = vfmadd132ss_fma(ZEXT416((uint)(auVar38._0_4_ - auVar40._0_4_)),auVar40,
                                        ZEXT416(*(uint *)&pAVar28[5]._vptr_Allocator));
              *(int *)((long)pvVar31 + lVar34 * 4) = auVar40._0_4_;
              pAVar28 = (Allocator *)((long)&pAVar28[5]._vptr_Allocator + 4);
            }
            pvVar31 = (void *)((long)pvVar31 + sVar14 * sVar15);
          }
        }
        goto LAB_0052d2ea;
      }
    }
    gridsample_nearest_apply_interpolation_p1(src,this_00,(Mat *)local_2a0,opt_00);
  }
  else {
    if (uVar9 != 4) {
      iVar35 = 0;
      if (uVar9 != 8) goto LAB_0052d2ea;
      if (iVar32 == 3) {
        iVar32 = (this->super_GridSample).sample_type;
        if (iVar32 == 3) {
          iVar24 = this_00->h * this_00->w;
          if (iVar24 < 1) {
            iVar24 = 0;
          }
          uVar27 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar27 = 0;
          }
          for (uVar26 = 0; iVar35 = 0, uVar26 != uVar27; uVar26 = uVar26 + 1) {
            lVar34 = src->cstep * uVar26 * src->elemsize;
            pvVar12 = src->data;
            pauVar29 = (undefined1 (*) [32])
                       (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
            pAVar28 = (Allocator *)local_2a0._0_8_;
            for (iVar32 = 0; iVar32 != iVar24; iVar32 = iVar32 + 1) {
              local_e0[0] = *(float *)&pAVar28->_vptr_Allocator;
              local_e0[1] = local_e0[0];
              local_e0[2] = local_e0[0];
              local_e0[3] = local_e0[0];
              fStack_d0 = local_e0[0];
              fStack_cc = local_e0[0];
              fStack_c8 = local_e0[0];
              fStack_c4 = local_e0[0];
              cubic_interp1d_p8((__m256 *)&local_120,(__m256 *)&local_140,(__m256 *)&local_160,
                                (__m256 *)&local_180,(__m256 *)local_e0);
              local_e0[0] = *(float *)((long)&pAVar28->_vptr_Allocator + 4);
              local_e0[1] = local_e0[0];
              local_e0[2] = local_e0[0];
              local_e0[3] = local_e0[0];
              fStack_d0 = local_e0[0];
              fStack_cc = local_e0[0];
              fStack_c8 = local_e0[0];
              fStack_c4 = local_e0[0];
              cubic_interp1d_p8((__m256 *)&local_1a0,(__m256 *)&local_1c0,(__m256 *)&local_1e0,
                                (__m256 *)&local_200,(__m256 *)local_e0);
              auVar57._4_12_ = auStack_13c;
              auVar57._0_4_ = local_140;
              auVar57._16_16_ = auStack_130;
              auVar50._4_12_ = auStack_15c;
              auVar50._0_4_ = local_160;
              auVar50._16_16_ = auStack_150;
              auVar49._4_12_ = auStack_17c;
              auVar49._0_4_ = local_180;
              auVar49._16_16_ = auStack_170;
              for (lVar33 = 0; lVar33 != 0x40; lVar33 = lVar33 + 0x10) {
                lVar25 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + lVar33);
                auVar45 = ZEXT832(0) << 0x40;
                auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                if (-1 < lVar25) {
                  auVar58 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar12 + lVar25 * 4 + lVar34));
                }
                lVar25 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + lVar33 + 4);
                if (-1 < lVar25) {
                  auVar45 = *(undefined1 (*) [32])((long)pvVar12 + lVar25 * 4 + lVar34);
                }
                lVar25 = (long)*(int *)((long)&pAVar28[2]._vptr_Allocator + lVar33);
                auVar52 = ZEXT1632(ZEXT816(0) << 0x40);
                auVar46 = ZEXT832(0) << 0x40;
                if (-1 < lVar25) {
                  auVar46 = *(undefined1 (*) [32])((long)pvVar12 + lVar25 * 4 + lVar34);
                }
                lVar25 = (long)*(int *)((long)&pAVar28[2]._vptr_Allocator + lVar33 + 4);
                if (-1 < lVar25) {
                  auVar52 = *(undefined1 (*) [32])((long)pvVar12 + lVar25 * 4 + lVar34);
                }
                auVar59._0_4_ = auVar58._0_4_ * local_120;
                auVar59._4_4_ = auVar58._4_4_ * fStack_11c;
                auVar59._8_4_ = auVar58._8_4_ * fStack_118;
                auVar59._12_4_ = auVar58._12_4_ * fStack_114;
                auVar59._16_4_ = auVar58._16_4_ * fStack_110;
                auVar59._20_4_ = auVar58._20_4_ * fStack_10c;
                auVar59._28_36_ = auVar58._28_36_;
                auVar59._24_4_ = auVar58._24_4_ * fStack_108;
                auVar40 = vfmadd213ps_fma(auVar45,auVar57,auVar59._0_32_);
                auVar40 = vfmadd213ps_fma(auVar46,auVar50,ZEXT1632(auVar40));
                auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar49,auVar52);
                *(undefined1 (*) [32])((long)local_e0 + lVar33 * 2) = ZEXT1632(auVar40);
              }
              auVar52._4_4_ = local_e0[1] * fStack_19c;
              auVar52._0_4_ = local_e0[0] * local_1a0;
              auVar52._8_4_ = local_e0[2] * fStack_198;
              auVar52._12_4_ = local_e0[3] * fStack_194;
              auVar52._16_4_ = fStack_d0 * fStack_190;
              auVar52._20_4_ = fStack_cc * fStack_18c;
              auVar52._24_4_ = fStack_c8 * fStack_188;
              auVar52._28_4_ = fStack_c4;
              auVar20._4_12_ = auStack_1bc;
              auVar20._0_4_ = local_1c0;
              auVar20._16_16_ = auStack_1b0;
              auVar22._16_16_ = auStack_b0;
              auVar22._0_16_ = local_c0;
              auVar40 = vfmadd132ps_fma(auVar20,auVar52,auVar22);
              auVar63._4_12_ = auStack_1dc;
              auVar63._0_4_ = local_1e0;
              auVar63._16_16_ = auStack_1d0;
              auVar40 = vfmadd132ps_fma(auVar63,ZEXT1632(auVar40),local_a0);
              auVar61._4_12_ = auStack_1fc;
              auVar61._0_4_ = local_200;
              auVar61._16_16_ = auStack_1f0;
              auVar40 = vfmadd132ps_fma(auVar61,ZEXT1632(auVar40),local_80);
              *pauVar29 = ZEXT1632(auVar40);
              pauVar29 = pauVar29 + 1;
              pAVar28 = pAVar28 + 9;
            }
          }
          goto LAB_0052d2ea;
        }
        if (iVar32 != 2) {
          iVar35 = iVar24;
          if (iVar32 == 1) {
            iVar24 = this_00->h * this_00->w;
            if (iVar24 < 1) {
              iVar24 = 0;
            }
            uVar27 = (ulong)(uint)this_00->c;
            if (this_00->c < 1) {
              uVar27 = 0;
            }
            for (uVar26 = 0; iVar35 = 0, uVar26 != uVar27; uVar26 = uVar26 + 1) {
              lVar34 = src->cstep * uVar26 * src->elemsize;
              pvVar12 = src->data;
              pauVar29 = (undefined1 (*) [32])
                         (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
              pAVar28 = (Allocator *)local_2a0._0_8_;
              iVar32 = iVar24;
              while (bVar37 = iVar32 != 0, iVar32 = iVar32 + -1, bVar37) {
                auVar46 = ZEXT832(0) << 0x40;
                auVar45 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar28->_vptr_Allocator) {
                  auVar45 = *(undefined1 (*) [32])
                             ((long)pvVar12 + (long)*(int *)&pAVar28->_vptr_Allocator * 4 + lVar34);
                }
                lVar33 = (long)*(int *)((long)&pAVar28->_vptr_Allocator + 4);
                if (-1 < lVar33) {
                  auVar46 = *(undefined1 (*) [32])((long)pvVar12 + lVar33 * 4 + lVar34);
                }
                auVar50 = ZEXT1632(ZEXT816(0) << 0x40);
                auVar49 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar28[1]._vptr_Allocator) {
                  auVar49 = *(undefined1 (*) [32])
                             ((long)pvVar12 + (long)*(int *)&pAVar28[1]._vptr_Allocator * 4 + lVar34
                             );
                }
                lVar33 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + 4);
                if (-1 < lVar33) {
                  auVar50 = *(undefined1 (*) [32])((long)pvVar12 + lVar33 * 4 + lVar34);
                }
                uVar2 = *(undefined4 *)&pAVar28[2]._vptr_Allocator;
                auVar55._4_4_ = uVar2;
                auVar55._0_4_ = uVar2;
                auVar55._8_4_ = uVar2;
                auVar55._12_4_ = uVar2;
                auVar55._16_4_ = uVar2;
                auVar55._20_4_ = uVar2;
                auVar55._24_4_ = uVar2;
                auVar55._28_4_ = uVar2;
                auVar40 = vfmsub231ps_fma(auVar45,auVar55,auVar45);
                auVar40 = vfmsub213ps_fma(auVar46,auVar55,ZEXT1632(auVar40));
                auVar38 = vfmsub231ps_fma(auVar49,auVar55,auVar49);
                auVar38 = vfnmadd231ps_fma(ZEXT1632(auVar38),auVar55,auVar50);
                uVar2 = *(undefined4 *)((long)&pAVar28[2]._vptr_Allocator + 4);
                auVar44._4_4_ = uVar2;
                auVar44._0_4_ = uVar2;
                auVar44._8_4_ = uVar2;
                auVar44._12_4_ = uVar2;
                auVar44._16_4_ = uVar2;
                auVar44._20_4_ = uVar2;
                auVar44._24_4_ = uVar2;
                auVar44._28_4_ = uVar2;
                auVar40 = vfmsub231ps_fma(ZEXT1632(auVar40),auVar44,ZEXT1632(auVar40));
                auVar40 = vfnmsub231ps_fma(ZEXT1632(auVar40),auVar44,ZEXT1632(auVar38));
                *pauVar29 = ZEXT1632(auVar40);
                pauVar29 = pauVar29 + 1;
                pAVar28 = pAVar28 + 3;
              }
            }
          }
          goto LAB_0052d2ea;
        }
      }
      else {
        iVar35 = iVar24;
        if (!bVar37) goto LAB_0052d2ea;
        iVar32 = (this->super_GridSample).sample_type;
        if (iVar32 != 2) {
          if (iVar32 == 1) {
            iVar24 = this_00->h * this_00->w * this_00->d;
            if (iVar24 < 1) {
              iVar24 = 0;
            }
            uVar27 = (ulong)(uint)this_00->c;
            if (this_00->c < 1) {
              uVar27 = 0;
            }
            for (uVar26 = 0; iVar35 = 0, uVar26 != uVar27; uVar26 = uVar26 + 1) {
              lVar34 = src->cstep * uVar26 * src->elemsize;
              pvVar12 = src->data;
              pauVar29 = (undefined1 (*) [32])
                         (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
              pAVar28 = (Allocator *)local_2a0._0_8_;
              iVar32 = iVar24;
              while (bVar37 = iVar32 != 0, iVar32 = iVar32 + -1, bVar37) {
                auVar46 = ZEXT832(0) << 0x40;
                auVar45 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar28->_vptr_Allocator) {
                  auVar45 = *(undefined1 (*) [32])
                             ((long)pvVar12 + (long)*(int *)&pAVar28->_vptr_Allocator * 4 + lVar34);
                }
                lVar33 = (long)*(int *)((long)&pAVar28->_vptr_Allocator + 4);
                if (-1 < lVar33) {
                  auVar46 = *(undefined1 (*) [32])((long)pvVar12 + lVar33 * 4 + lVar34);
                }
                auVar50 = ZEXT832(0) << 0x40;
                auVar49 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar28[1]._vptr_Allocator) {
                  auVar49 = *(undefined1 (*) [32])
                             ((long)pvVar12 + (long)*(int *)&pAVar28[1]._vptr_Allocator * 4 + lVar34
                             );
                }
                lVar33 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + 4);
                if (-1 < lVar33) {
                  auVar50 = *(undefined1 (*) [32])((long)pvVar12 + lVar33 * 4 + lVar34);
                }
                auVar52 = ZEXT832(0) << 0x40;
                auVar57 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar28[2]._vptr_Allocator) {
                  auVar57 = *(undefined1 (*) [32])
                             ((long)pvVar12 + (long)*(int *)&pAVar28[2]._vptr_Allocator * 4 + lVar34
                             );
                }
                lVar33 = (long)*(int *)((long)&pAVar28[2]._vptr_Allocator + 4);
                if (-1 < lVar33) {
                  auVar52 = *(undefined1 (*) [32])((long)pvVar12 + lVar33 * 4 + lVar34);
                }
                auVar63 = ZEXT1632(ZEXT816(0) << 0x40);
                auVar61 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar28[3]._vptr_Allocator) {
                  auVar61 = *(undefined1 (*) [32])
                             ((long)pvVar12 + (long)*(int *)&pAVar28[3]._vptr_Allocator * 4 + lVar34
                             );
                }
                lVar33 = (long)*(int *)((long)&pAVar28[3]._vptr_Allocator + 4);
                if (-1 < lVar33) {
                  auVar63 = *(undefined1 (*) [32])((long)pvVar12 + lVar33 * 4 + lVar34);
                }
                uVar2 = *(undefined4 *)&pAVar28[4]._vptr_Allocator;
                auVar66._4_4_ = uVar2;
                auVar66._0_4_ = uVar2;
                auVar66._8_4_ = uVar2;
                auVar66._12_4_ = uVar2;
                auVar66._16_4_ = uVar2;
                auVar66._20_4_ = uVar2;
                auVar66._24_4_ = uVar2;
                auVar66._28_4_ = uVar2;
                auVar40 = vfmsub231ps_fma(auVar45,auVar66,auVar45);
                auVar40 = vfmsub213ps_fma(auVar46,auVar66,ZEXT1632(auVar40));
                auVar38 = vfmsub231ps_fma(auVar49,auVar66,auVar49);
                auVar48 = vfnmadd213ps_fma(auVar50,auVar66,ZEXT1632(auVar38));
                auVar38 = vfmsub231ps_fma(auVar57,auVar66,auVar57);
                auVar38 = vfmsub213ps_fma(auVar52,auVar66,ZEXT1632(auVar38));
                auVar43 = vfmsub231ps_fma(auVar61,auVar66,auVar61);
                uVar2 = *(undefined4 *)((long)&pAVar28[4]._vptr_Allocator + 4);
                auVar45._4_4_ = uVar2;
                auVar45._0_4_ = uVar2;
                auVar45._8_4_ = uVar2;
                auVar45._12_4_ = uVar2;
                auVar45._16_4_ = uVar2;
                auVar45._20_4_ = uVar2;
                auVar45._24_4_ = uVar2;
                auVar45._28_4_ = uVar2;
                auVar43 = vfnmadd231ps_fma(ZEXT1632(auVar43),auVar66,auVar63);
                auVar40 = vfmsub231ps_fma(ZEXT1632(auVar40),auVar45,ZEXT1632(auVar40));
                auVar48 = vfnmsub231ps_fma(ZEXT1632(auVar40),auVar45,ZEXT1632(auVar48));
                auVar40 = vfmsub231ps_fma(ZEXT1632(auVar38),auVar45,ZEXT1632(auVar38));
                auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar45,ZEXT1632(auVar43));
                uVar2 = *(undefined4 *)&pAVar28[5]._vptr_Allocator;
                auVar46._4_4_ = uVar2;
                auVar46._0_4_ = uVar2;
                auVar46._8_4_ = uVar2;
                auVar46._12_4_ = uVar2;
                auVar46._16_4_ = uVar2;
                auVar46._20_4_ = uVar2;
                auVar46._24_4_ = uVar2;
                auVar46._28_4_ = uVar2;
                auVar38 = vfmsub231ps_fma(ZEXT1632(auVar48),auVar46,ZEXT1632(auVar48));
                auVar40 = vfnmsub231ps_fma(ZEXT1632(auVar38),auVar46,ZEXT1632(auVar40));
                *pauVar29 = ZEXT1632(auVar40);
                pauVar29 = pauVar29 + 1;
                pAVar28 = (Allocator *)((long)&pAVar28[5]._vptr_Allocator + 4);
              }
            }
          }
          goto LAB_0052d2ea;
        }
      }
      gridsample_nearest_apply_interpolation_p8(src,this_00,(Mat *)local_2a0,opt_00);
      iVar35 = iVar24;
      goto LAB_0052d2ea;
    }
    if (iVar32 == 3) {
      iVar24 = (this->super_GridSample).sample_type;
      if (iVar24 == 3) {
        iVar24 = this_00->h * this_00->w;
        uVar27 = 0;
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        uVar9 = this_00->c;
        if (this_00->c < 1) {
          uVar9 = 0;
        }
        for (; uVar27 != uVar9; uVar27 = uVar27 + 1) {
          lVar34 = src->cstep * uVar27 * src->elemsize;
          pvVar12 = src->data;
          pauVar30 = (undefined1 (*) [16])
                     (this_00->cstep * uVar27 * this_00->elemsize + (long)this_00->data);
          pAVar28 = (Allocator *)local_2a0._0_8_;
          for (iVar32 = 0; iVar32 != iVar24; iVar32 = iVar32 + 1) {
            local_f0 = *(float *)&pAVar28->_vptr_Allocator;
            fStack_ec = local_f0;
            fStack_e8 = local_f0;
            auStack_e4 = (undefined1  [4])local_f0;
            cubic_interp1d_p4((__m128 *)&local_120,(__m128 *)&local_140,(__m128 *)&local_160,
                              (__m128 *)&local_180,(__m128 *)&local_f0);
            local_f0 = *(float *)((long)&pAVar28->_vptr_Allocator + 4);
            fStack_ec = local_f0;
            fStack_e8 = local_f0;
            auStack_e4 = (undefined1  [4])local_f0;
            cubic_interp1d_p4((__m128 *)&local_1a0,(__m128 *)&local_1c0,(__m128 *)&local_1e0,
                              (__m128 *)&local_200,(__m128 *)&local_f0);
            auVar51._4_12_ = auStack_13c;
            auVar51._0_4_ = local_140;
            auVar48._4_12_ = auStack_15c;
            auVar48._0_4_ = local_160;
            auVar40._4_12_ = auStack_17c;
            auVar40._0_4_ = local_180;
            for (lVar33 = 0; lVar33 != 0x40; lVar33 = lVar33 + 0x10) {
              lVar25 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + lVar33);
              auVar38 = ZEXT816(0) << 0x40;
              fVar47 = 0.0;
              fVar53 = 0.0;
              fVar60 = 0.0;
              fVar64 = 0.0;
              if (-1 < lVar25) {
                pfVar1 = (float *)((long)pvVar12 + lVar25 * 4 + lVar34);
                fVar47 = *pfVar1;
                fVar53 = pfVar1[1];
                fVar60 = pfVar1[2];
                fVar64 = pfVar1[3];
              }
              lVar25 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + lVar33 + 4);
              if (-1 < lVar25) {
                auVar38 = *(undefined1 (*) [16])((long)pvVar12 + lVar25 * 4 + lVar34);
              }
              lVar25 = (long)*(int *)((long)&pAVar28[2]._vptr_Allocator + lVar33);
              auVar42 = ZEXT816(0) << 0x40;
              auVar43 = ZEXT816(0) << 0x40;
              if (-1 < lVar25) {
                auVar43 = *(undefined1 (*) [16])((long)pvVar12 + lVar25 * 4 + lVar34);
              }
              lVar25 = (long)*(int *)((long)&pAVar28[2]._vptr_Allocator + lVar33 + 4);
              if (-1 < lVar25) {
                auVar42 = *(undefined1 (*) [16])((long)pvVar12 + lVar25 * 4 + lVar34);
              }
              auVar56._0_4_ = fVar47 * local_120;
              auVar56._4_4_ = fVar53 * fStack_11c;
              auVar56._8_4_ = fVar60 * fStack_118;
              auVar56._12_4_ = fVar64 * fStack_114;
              auVar38 = vfmadd213ps_fma(auVar38,auVar51,auVar56);
              auVar38 = vfmadd213ps_fma(auVar43,auVar48,auVar38);
              auVar38 = vfmadd231ps_fma(auVar38,auVar40,auVar42);
              *(undefined1 (*) [16])((long)local_e0 + lVar33) = auVar38;
            }
            auVar39._0_4_ = local_e0[0] * local_1a0;
            auVar39._4_4_ = local_e0[1] * fStack_19c;
            auVar39._8_4_ = local_e0[2] * fStack_198;
            auVar39._12_4_ = local_e0[3] * fStack_194;
            auVar19._4_12_ = auStack_1bc;
            auVar19._0_4_ = local_1c0;
            auVar21._4_4_ = fStack_cc;
            auVar21._0_4_ = fStack_d0;
            auVar21._8_4_ = fStack_c8;
            auVar21._12_4_ = fStack_c4;
            auVar40 = vfmadd132ps_fma(auVar19,auVar39,auVar21);
            auVar18._4_12_ = auStack_1dc;
            auVar18._0_4_ = local_1e0;
            auVar40 = vfmadd132ps_fma(auVar18,auVar40,local_c0);
            auVar62._4_12_ = auStack_1fc;
            auVar62._0_4_ = local_200;
            auVar40 = vfmadd132ps_fma(auVar62,auVar40,auStack_b0);
            *pauVar30 = auVar40;
            pauVar30 = pauVar30 + 1;
            pAVar28 = pAVar28 + 9;
          }
        }
        goto LAB_0052d091;
      }
      if (iVar24 != 2) {
        if (iVar24 == 1) {
          iVar24 = this_00->h * this_00->w;
          if (iVar24 < 1) {
            iVar24 = 0;
          }
          uVar27 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar27 = 0;
          }
          for (uVar26 = 0; iVar35 = 0, uVar26 != uVar27; uVar26 = uVar26 + 1) {
            lVar34 = src->cstep * uVar26 * src->elemsize;
            pvVar12 = src->data;
            pauVar30 = (undefined1 (*) [16])
                       (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
            pAVar28 = (Allocator *)local_2a0._0_8_;
            iVar32 = iVar24;
            while (bVar37 = iVar32 != 0, iVar32 = iVar32 + -1, bVar37) {
              auVar38 = ZEXT816(0) << 0x40;
              auVar40 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28->_vptr_Allocator) {
                auVar40 = *(undefined1 (*) [16])
                           ((long)pvVar12 + (long)*(int *)&pAVar28->_vptr_Allocator * 4 + lVar34);
              }
              lVar33 = (long)*(int *)((long)&pAVar28->_vptr_Allocator + 4);
              if (-1 < lVar33) {
                auVar38 = *(undefined1 (*) [16])((long)pvVar12 + lVar33 * 4 + lVar34);
              }
              auVar48 = ZEXT816(0) << 0x40;
              auVar43 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28[1]._vptr_Allocator) {
                auVar43 = *(undefined1 (*) [16])
                           ((long)pvVar12 + (long)*(int *)&pAVar28[1]._vptr_Allocator * 4 + lVar34);
              }
              lVar33 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + 4);
              if (-1 < lVar33) {
                auVar48 = *(undefined1 (*) [16])((long)pvVar12 + lVar33 * 4 + lVar34);
              }
              uVar2 = *(undefined4 *)&pAVar28[2]._vptr_Allocator;
              auVar54._4_4_ = uVar2;
              auVar54._0_4_ = uVar2;
              auVar54._8_4_ = uVar2;
              auVar54._12_4_ = uVar2;
              auVar40 = vfmsub231ps_fma(auVar40,auVar54,auVar40);
              auVar40 = vfmsub213ps_fma(auVar38,auVar54,auVar40);
              auVar38 = vfmsub231ps_fma(auVar43,auVar54,auVar43);
              auVar38 = vfnmadd231ps_fma(auVar38,auVar54,auVar48);
              uVar2 = *(undefined4 *)((long)&pAVar28[2]._vptr_Allocator + 4);
              auVar41._4_4_ = uVar2;
              auVar41._0_4_ = uVar2;
              auVar41._8_4_ = uVar2;
              auVar41._12_4_ = uVar2;
              auVar40 = vfmsub231ps_fma(auVar40,auVar41,auVar40);
              auVar40 = vfnmsub231ps_fma(auVar40,auVar41,auVar38);
              *pauVar30 = auVar40;
              pauVar30 = pauVar30 + 1;
              pAVar28 = pAVar28 + 3;
            }
          }
        }
        goto LAB_0052d2ea;
      }
    }
    else {
      if (!bVar37) goto LAB_0052d2ea;
      iVar24 = (this->super_GridSample).sample_type;
      if (iVar24 != 2) {
        if (iVar24 == 1) {
          iVar24 = this_00->h * this_00->w * this_00->d;
          if (iVar24 < 1) {
            iVar24 = 0;
          }
          uVar27 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar27 = 0;
          }
          for (uVar26 = 0; iVar35 = 0, uVar26 != uVar27; uVar26 = uVar26 + 1) {
            lVar34 = src->cstep * uVar26 * src->elemsize;
            pvVar12 = src->data;
            pauVar30 = (undefined1 (*) [16])
                       (this_00->cstep * uVar26 * this_00->elemsize + (long)this_00->data);
            pAVar28 = (Allocator *)local_2a0._0_8_;
            iVar32 = iVar24;
            while (bVar37 = iVar32 != 0, iVar32 = iVar32 + -1, bVar37) {
              auVar38 = ZEXT816(0) << 0x40;
              auVar40 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28->_vptr_Allocator) {
                auVar40 = *(undefined1 (*) [16])
                           ((long)pvVar12 + (long)*(int *)&pAVar28->_vptr_Allocator * 4 + lVar34);
              }
              lVar33 = (long)*(int *)((long)&pAVar28->_vptr_Allocator + 4);
              if (-1 < lVar33) {
                auVar38 = *(undefined1 (*) [16])((long)pvVar12 + lVar33 * 4 + lVar34);
              }
              auVar48 = ZEXT816(0) << 0x40;
              auVar43 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28[1]._vptr_Allocator) {
                auVar43 = *(undefined1 (*) [16])
                           ((long)pvVar12 + (long)*(int *)&pAVar28[1]._vptr_Allocator * 4 + lVar34);
              }
              lVar33 = (long)*(int *)((long)&pAVar28[1]._vptr_Allocator + 4);
              if (-1 < lVar33) {
                auVar48 = *(undefined1 (*) [16])((long)pvVar12 + lVar33 * 4 + lVar34);
              }
              auVar51 = ZEXT816(0) << 0x40;
              auVar42 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28[2]._vptr_Allocator) {
                auVar42 = *(undefined1 (*) [16])
                           ((long)pvVar12 + (long)*(int *)&pAVar28[2]._vptr_Allocator * 4 + lVar34);
              }
              lVar33 = (long)*(int *)((long)&pAVar28[2]._vptr_Allocator + 4);
              if (-1 < lVar33) {
                auVar51 = *(undefined1 (*) [16])((long)pvVar12 + lVar33 * 4 + lVar34);
              }
              auVar62 = ZEXT816(0) << 0x40;
              auVar56 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar28[3]._vptr_Allocator) {
                auVar56 = *(undefined1 (*) [16])
                           ((long)pvVar12 + (long)*(int *)&pAVar28[3]._vptr_Allocator * 4 + lVar34);
              }
              lVar33 = (long)*(int *)((long)&pAVar28[3]._vptr_Allocator + 4);
              if (-1 < lVar33) {
                auVar62 = *(undefined1 (*) [16])((long)pvVar12 + lVar33 * 4 + lVar34);
              }
              uVar2 = *(undefined4 *)&pAVar28[4]._vptr_Allocator;
              auVar65._4_4_ = uVar2;
              auVar65._0_4_ = uVar2;
              auVar65._8_4_ = uVar2;
              auVar65._12_4_ = uVar2;
              auVar40 = vfmsub231ps_fma(auVar40,auVar65,auVar40);
              auVar40 = vfmsub213ps_fma(auVar38,auVar65,auVar40);
              auVar38 = vfmsub231ps_fma(auVar43,auVar65,auVar43);
              auVar48 = vfnmadd213ps_fma(auVar48,auVar65,auVar38);
              auVar38 = vfmsub231ps_fma(auVar42,auVar65,auVar42);
              auVar38 = vfmsub213ps_fma(auVar51,auVar65,auVar38);
              auVar43 = vfmsub231ps_fma(auVar56,auVar65,auVar56);
              auVar43 = vfnmadd231ps_fma(auVar43,auVar65,auVar62);
              uVar2 = *(undefined4 *)((long)&pAVar28[4]._vptr_Allocator + 4);
              auVar42._4_4_ = uVar2;
              auVar42._0_4_ = uVar2;
              auVar42._8_4_ = uVar2;
              auVar42._12_4_ = uVar2;
              auVar40 = vfmsub231ps_fma(auVar40,auVar42,auVar40);
              auVar48 = vfnmsub231ps_fma(auVar40,auVar42,auVar48);
              auVar40 = vfmsub231ps_fma(auVar38,auVar42,auVar38);
              auVar40 = vfmadd231ps_fma(auVar40,auVar42,auVar43);
              uVar2 = *(undefined4 *)&pAVar28[5]._vptr_Allocator;
              auVar43._4_4_ = uVar2;
              auVar43._0_4_ = uVar2;
              auVar43._8_4_ = uVar2;
              auVar43._12_4_ = uVar2;
              auVar38 = vfmsub231ps_fma(auVar48,auVar43,auVar48);
              auVar40 = vfnmsub231ps_fma(auVar38,auVar43,auVar40);
              *pauVar30 = auVar40;
              pauVar30 = pauVar30 + 1;
              pAVar28 = (Allocator *)((long)&pAVar28[5]._vptr_Allocator + 4);
            }
          }
        }
        goto LAB_0052d2ea;
      }
    }
    gridsample_nearest_apply_interpolation_p4(src,this_00,(Mat *)local_2a0,opt_00);
  }
LAB_0052d2ea:
  piVar11 = (int *)CONCAT44(local_250.refcount._4_4_,(int)local_250.refcount);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_250.allocator == (Allocator *)0x0) {
        free(local_250.data);
      }
      else {
        (*(local_250.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar11 = (int *)CONCAT44(local_2a0._12_4_,local_2a0._8_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_280 == (Allocator *)0x0) {
        free((void *)local_2a0._0_8_);
      }
      else {
        (*local_280->_vptr_Allocator[3])();
      }
    }
  }
  return iVar35;
}

Assistant:

int GridSample_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];
    int elempack = bottom_blob.elempack;

    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw, outh, outd;
    Mat offset_value_blob;

    Mat grid_p1;
    if (grid.elempack != 1)
    {
        convert_packing(grid, grid_p1, 1, opt);
    }
    else
    {
        grid_p1 = grid;
    }

    if (dims == 3)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.c : grid_p1.h;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, elemsize * 6, 6, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_BICUBIC)
        {
            offset_value_blob.create(outw, outh, elemsize * 18, 18, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }
    }

    if (dims == 4)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.d : grid_p1.h;
        outd = permute_fusion == 0 ? grid_p1.c : grid_p1.d;

        top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, outd, elemsize * 11, 11, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, outd, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -100;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __AVX__
    if (elempack == 4)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

    return 0;
}